

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O2

int SetAllPWMsRoboteq(ROBOTEQ *pRoboteq,int *selectedchannels,int *pws)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  int pws_tmp [3];
  int iStack_34;
  
  pws_tmp[2] = pws[2];
  pws_tmp._0_8_ = *(undefined8 *)pws;
  iVar4 = 0;
  bVar7 = false;
  for (lVar6 = -3; lVar6 != 0; lVar6 = lVar6 + 1) {
    if (selectedchannels[lVar6 + 3] != 0) {
      iVar2 = (int)((double)((&iStack_34)[lVar6] + -0x5dc) *
                   *(double *)(pRoboteq->bProportionalPWs + lVar6 * 2));
      if (pRoboteq->bProportionalPWs[lVar6 + 3] == 0) {
        iVar2 = iVar2 + 0x5dc;
      }
      else {
        iVar5 = pRoboteq->MaxPWs[lVar6];
        if (iVar2 < 0) {
          iVar2 = ((pRoboteq->MidPWs[lVar6] - iVar5) * iVar2) / -500;
        }
        else {
          iVar2 = ((pRoboteq->InitPWs[lVar6] - iVar5) * iVar2) / 500;
        }
        iVar2 = iVar2 + iVar5;
      }
      if (pRoboteq->InitPWs[lVar6] <= iVar2) {
        iVar2 = pRoboteq->InitPWs[lVar6];
      }
      if (iVar2 <= pRoboteq->MidPWs[lVar6]) {
        iVar2 = pRoboteq->MidPWs[lVar6];
      }
      (&iStack_34)[lVar6] = iVar2;
      iVar3 = iVar2 - pRoboteq->LastAIs[lVar6];
      iVar5 = -iVar3;
      if (0 < iVar3) {
        iVar5 = iVar3;
      }
      if (pRoboteq->ThresholdPWs[lVar6 + 3] <= iVar5) {
        bVar1 = !bVar7;
        bVar7 = true;
        if (bVar1) {
          iVar2 = SetCommandRoboteq(pRoboteq,0,(int)lVar6 + 4,iVar2 * 2 + -3000);
          bVar7 = iVar2 != 0;
        }
        iVar4 = iVar4 + 1;
      }
    }
  }
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else if (bVar7) {
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      if (selectedchannels[lVar6] != 0) {
        iVar5 = pws_tmp[lVar6] - pRoboteq->LastPWs[lVar6];
        iVar2 = -iVar5;
        if (0 < iVar5) {
          iVar2 = iVar5;
        }
        if (pRoboteq->ThresholdPWs[lVar6] <= iVar2) {
          pRoboteq->LastPWs[lVar6] = pws_tmp[lVar6];
        }
      }
    }
  }
  return iVar4;
}

Assistant:

inline int SetAllPWMsRoboteq(ROBOTEQ* pRoboteq, int* selectedchannels, int* pws)
{
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_ROBOTEQ];
	int nbselectedchannels = 0;
	int res = EXIT_SUCCESS;

	nbselectedchannels = 0;

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (!selectedchannels[channel]) continue;

		if (pRoboteq->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pRoboteq->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pRoboteq->MidPWs[channel]+pws_tmp[channel]*(pRoboteq->MaxPWs[channel]-pRoboteq->MidPWs[channel])
				/(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MID_PW_ROBOTEQ);
			else
				pws_tmp[channel] = pRoboteq->MidPWs[channel]+pws_tmp[channel]*(pRoboteq->MinPWs[channel]-pRoboteq->MidPWs[channel])
				/(DEFAULT_MIN_PW_ROBOTEQ-DEFAULT_MID_PW_ROBOTEQ);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_ROBOTEQ+(int)(pRoboteq->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pRoboteq->MaxPWs[channel]), pRoboteq->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_ROBOTEQ), DEFAULT_ABSOLUTE_MIN_PW_ROBOTEQ);

		// The requested PWM is only applied if it is slightly different from the current value.
		if (abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]) < pRoboteq->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pRoboteq->LastPWs[channel], abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]), pRoboteq->ThresholdPWs[channel]);
		
		res = (res || SetCommandRoboteq(pRoboteq, _GO_ROBOTEQ, channel+1, 2*(pws_tmp[channel]-DEFAULT_MID_PW_ROBOTEQ)*(DEFAULT_MAX_PW_ROBOTEQ-DEFAULT_MIN_PW_ROBOTEQ)/1000));

		nbselectedchannels++;
	}

	if (nbselectedchannels == 0) return EXIT_SUCCESS;
	
	if (res != EXIT_SUCCESS) return res;

	for (channel = 0; channel < NB_CHANNELS_PWM_ROBOTEQ; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pRoboteq->LastPWs[channel]) < pRoboteq->ThresholdPWs[channel]) continue;

		// Update last known value.
		pRoboteq->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}